

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_trn_u8(TCGContext_conflict1 *tcg_ctx,TCGv_i32 t0,TCGv_i32 t1)

{
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 tmp;
  TCGv_i32 rd;
  TCGv_i32 t1_local;
  TCGv_i32 t0_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_shli_i32_aarch64(tcg_ctx,ret,t0,8);
  tcg_gen_andi_i32_aarch64(tcg_ctx,ret,ret,-0xff0100);
  tcg_gen_andi_i32_aarch64(tcg_ctx,ret_00,t1,0xff00ff);
  tcg_gen_or_i32(tcg_ctx,ret,ret,ret_00);
  tcg_gen_shri_i32_aarch64(tcg_ctx,t1,t1,8);
  tcg_gen_andi_i32_aarch64(tcg_ctx,t1,t1,0xff00ff);
  tcg_gen_andi_i32_aarch64(tcg_ctx,ret_00,t0,-0xff0100);
  tcg_gen_or_i32(tcg_ctx,t1,t1,ret_00);
  tcg_gen_mov_i32(tcg_ctx,t0,ret);
  tcg_temp_free_i32(tcg_ctx,ret_00);
  tcg_temp_free_i32(tcg_ctx,ret);
  return;
}

Assistant:

static void gen_neon_trn_u8(TCGContext *tcg_ctx, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 rd, tmp;

    rd = tcg_temp_new_i32(tcg_ctx);
    tmp = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_shli_i32(tcg_ctx, rd, t0, 8);
    tcg_gen_andi_i32(tcg_ctx, rd, rd, 0xff00ff00);
    tcg_gen_andi_i32(tcg_ctx, tmp, t1, 0x00ff00ff);
    tcg_gen_or_i32(tcg_ctx, rd, rd, tmp);

    tcg_gen_shri_i32(tcg_ctx, t1, t1, 8);
    tcg_gen_andi_i32(tcg_ctx, t1, t1, 0x00ff00ff);
    tcg_gen_andi_i32(tcg_ctx, tmp, t0, 0xff00ff00);
    tcg_gen_or_i32(tcg_ctx, t1, t1, tmp);
    tcg_gen_mov_i32(tcg_ctx, t0, rd);

    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_temp_free_i32(tcg_ctx, rd);
}